

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool float_cast_helper<unsigned_long,_true>::Test(double d)

{
  unsigned_long uVar1;
  double in_XMM0_Qa;
  uint64_t maxUnsignedDouble;
  uint64_t signifDouble;
  undefined1 local_1;
  
  if ((in_XMM0_Qa < 0.0) || (1.844674407370955e+19 < in_XMM0_Qa)) {
    local_1 = false;
  }
  else {
    uVar1 = std::numeric_limits<unsigned_long>::max();
    if (uVar1 < (ulong)((long)in_XMM0_Qa |
                       (long)(in_XMM0_Qa - 9.223372036854776e+18) & (long)in_XMM0_Qa >> 0x3f)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool  Test(double d)
    {
        const std::uint64_t signifDouble = 0x1fffffffffffff;

        // Anything larger than this either is larger than 2^64-1, or cannot be represented by a double
        const std::uint64_t maxUnsignedDouble = signifDouble << 11;

        // There is the possibility of both negative and positive zero,
        // but we'll allow either, since (-0.0 < 0) == false
        // if we wanted to change that, then use the signbit() macro
        if (d < 0 || d > static_cast<double>(maxUnsignedDouble))
            return false;

        // The input can now safely be cast to an unsigned long long
        if (static_cast<std::uint64_t>(d) > std::numeric_limits<T>::max())
            return false;

        return true;
    }